

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

string * anon_unknown.dwarf_205eb19::computeInstallObjectDir
                   (string *__return_storage_ptr__,cmGeneratorTarget *gt,string *config)

{
  string *psVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"objects","");
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(config->_M_dataplus)._M_p);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
  psVar1 = (string *)
           std::__cxx11::string::_M_append
                     ((char *)__return_storage_ptr__,(ulong)(psVar1->_M_dataplus)._M_p);
  return psVar1;
}

Assistant:

std::string computeInstallObjectDir(cmGeneratorTarget* gt,
                                    std::string const& config)
{
  std::string objectDir = "objects";
  if (!config.empty()) {
    objectDir += "-";
    objectDir += config;
  }
  objectDir += "/";
  objectDir += gt->GetName();
  return objectDir;
}